

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pine.cc
# Opt level: O2

void __thiscall OB::Pine::Pine(Pine *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->file_main_)._M_dataplus._M_p = (pointer)&(this->file_main_).field_2;
  (this->file_main_)._M_string_length = 0;
  (this->file_main_).field_2._M_local_buf[0] = '\0';
  Flags::Flags(&this->flg);
  p_Var1 = &(this->lbl)._M_t._M_impl.super__Rb_tree_header;
  (this->lbl)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lbl)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stk).super__Vector_base<OB::Pine::Instruction,_std::allocator<OB::Pine::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stk).super__Vector_base<OB::Pine::Instruction,_std::allocator<OB::Pine::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stk).super__Vector_base<OB::Pine::Instruction,_std::allocator<OB::Pine::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cst).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->cst).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->cst).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lbl)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lbl)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lbl)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->smap)._M_t._M_impl.super__Rb_tree_header;
  (this->smap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->smap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->smap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->smap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->smap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Pine::Pine()
  {
  }